

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * google::ShellEscape(string *__return_storage_ptr__,string *src)

{
  pointer __s;
  uint uVar1;
  size_type sVar2;
  void *pvVar3;
  string *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *__s_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (src->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(src,
                              "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                              ,0,0x47);
    if (sVar2 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (__return_storage_ptr__,src);
      return extraout_RAX;
    }
    if (src->_M_string_length == 0) {
      sVar2 = __return_storage_ptr__->_M_string_length;
    }
    else {
      __s = (src->_M_dataplus)._M_p;
      pvVar3 = memchr(__s,0x27,src->_M_string_length);
      sVar2 = __return_storage_ptr__->_M_string_length;
      if (pvVar3 != (void *)0x0 && (long)pvVar3 - (long)__s != -1) {
        __s_00 = "\"";
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (__return_storage_ptr__,0,sVar2,"\"",1);
        if (src->_M_string_length != 0) {
          sVar2 = 0;
          do {
            uVar1 = (byte)(src->_M_dataplus)._M_p[sVar2] - 0x22;
            if ((uVar1 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,"\\");
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,src,sVar2,1);
            sVar2 = sVar2 + 1;
          } while (sVar2 < src->_M_string_length);
        }
        goto LAB_00127d8c;
      }
    }
  }
  __s_00 = "\'";
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (__return_storage_ptr__,0,sVar2,"\'",1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(src->_M_dataplus)._M_p,src->_M_string_length);
LAB_00127d8c:
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (__return_storage_ptr__,__s_00);
  return pbVar4;
}

Assistant:

static string ShellEscape(const string& src) {
  string result;
  if (!src.empty() &&  // empty string needs quotes
      src.find_first_not_of(kDontNeedShellEscapeChars) == string::npos) {
    // only contains chars that don't need quotes; it's fine
    result.assign(src);
  } else if (src.find_first_of('\'') == string::npos) {
    // no single quotes; just wrap it in single quotes
    result.assign("'");
    result.append(src);
    result.append("'");
  } else {
    // needs double quote escaping
    result.assign("\"");
    for (size_t i = 0; i < src.size(); ++i) {
      switch (src[i]) {
        case '\\':
        case '$':
        case '"':
        case '`':
          result.append("\\");
      }
      result.append(src, i, 1);
    }
    result.append("\"");
  }
  return result;
}